

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot_landscapes.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Persistence_landscape l;
  Persistence_landscape local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "This program creates a gnuplot script from a persistence landscape stored in a file (the file needs "
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "to be created beforehand). Please call the code with the name of a single landscape file.\n"
             ,0x5a);
  if (argc != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n",0x36)
    ;
  }
  else {
    local_48.land.
    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.land.
    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.land.
    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.number_of_functions_for_vectorization = 0;
    local_48.number_of_functions_for_projections_to_reals =
         local_48.number_of_functions_for_vectorization;
    Gudhi::Persistence_representations::Persistence_landscape::load_landscape_from_file
              (&local_48,argv[1]);
    Gudhi::Persistence_representations::Persistence_landscape::plot
              (&local_48,argv[1],1.79769313486232e+308,1.79769313486232e+308,1.79769313486232e+308,
               1.79769313486232e+308,0x7fffffff,0x7fffffff);
    std::
    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ::~vector(&local_48.land);
  }
  return (uint)(argc != 2);
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates a gnuplot script from a persistence landscape stored in a file (the file needs "
            << "to be created beforehand). Please call the code with the name of a single landscape file.\n";
  if (argc != 2) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }

  Persistence_landscape l;
  l.load_landscape_from_file(argv[1]);
  l.plot(argv[1]);

  return 0;
}